

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O0

float __thiscall MXNetNode::attr_f(MXNetNode *this,char *key)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  int nscan;
  float f;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff68;
  float local_64;
  _Self in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_41;
  string local_40 [32];
  _Self local_20 [3];
  float local_4;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (allocator<char> *)in_stack_ffffffffffffffa0._M_node);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0x10780e);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::end(in_stack_ffffffffffffff68);
  bVar1 = std::operator==(local_20,(_Self *)&stack0xffffffffffffffa0);
  if (bVar1) {
    local_4 = 0.0;
  }
  else {
    local_64 = 0.0;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1078b3);
    uVar3 = std::__cxx11::string::c_str();
    iVar2 = __isoc99_sscanf(uVar3,"%f",&local_64);
    if (iVar2 == 1) {
      local_4 = local_64;
    }
    else {
      local_4 = 0.0;
    }
  }
  return local_4;
}

Assistant:

float MXNetNode::attr_f(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return 0.f;

    float f = 0;
    int nscan = sscanf(it->second.c_str(), "%f", &f);
    if (nscan != 1)
        return 0.f;

    return f;
}